

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sliced_Wasserstein.h
# Opt level: O1

double __thiscall
Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance
          (Sliced_Wasserstein *this,Sliced_Wasserstein *second)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  void *pvVar4;
  double dVar5;
  void *pvVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  iterator iVar8;
  Sliced_Wasserstein *this_00;
  uint uVar9;
  invalid_argument *this_01;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  size_type __n;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  int q;
  vector<double,_std::allocator<double>_> v2;
  int p;
  vector<int,_std::allocator<int>_> order1;
  double theta;
  Persistence_diagram diagram1;
  vector<int,_std::allocator<int>_> orderp2;
  vector<int,_std::allocator<int>_> orderp1;
  Persistence_diagram diagram2;
  vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  angles2;
  vector<int,_std::allocator<int>_> order2;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  anglePerm2;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  anglePerm1;
  default_random_engine re;
  vector<double,_std::allocator<double>_> v1;
  int local_1534;
  double local_1530;
  double local_1528;
  double local_1520;
  void *local_1518;
  void *pvStack_1510;
  long local_1508;
  double local_1500;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_14f8;
  vector<int,_std::allocator<int>_> local_14e0;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_14c8;
  double local_14a8;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_14a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1488;
  iterator iStack_1480;
  int *local_1478;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1468;
  iterator iStack_1460;
  int *local_1458;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_1450;
  void *local_1438;
  void *pvStack_1430;
  long local_1428;
  double local_1418;
  vector<int,_std::allocator<int>_> local_1410;
  Sliced_Wasserstein *local_13f8;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  local_13f0;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  local_13d8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13c0;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  if (this->approx != second->approx) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_01,"Error: different approx values for representations");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&local_14a0,&this->diagram);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&local_1450,&second->diagram);
  if (this->approx == -1) {
    uVar12 = (long)local_14a0.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_14a0.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = (uint)((ulong)((long)local_1450.
                                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1450.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
    local_13f8 = this;
    if ((int)uVar9 < 1) {
      local_1528 = 1.79769313486232e+308;
      dVar19 = -1.79769313486232e+308;
      dVar18 = -1.79769313486232e+308;
      local_1520 = 1.79769313486232e+308;
    }
    else {
      uVar14 = (ulong)(uVar9 & 0x7fffffff);
      dVar18 = -1.79769313486232e+308;
      uVar16 = 0xffffffff;
      uVar17 = 0x7fefffff;
      lVar11 = 8;
      local_1528 = 1.79769313486232e+308;
      dVar19 = -1.79769313486232e+308;
      do {
        local_1530 = (double)CONCAT44(uVar17,uVar16);
        local_1520 = *(double *)
                      ((long)&(local_1450.
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + lVar11);
        local_13b8.field_0._M_file =
             (void *)((*(double *)
                        ((long)local_1450.
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8) +
                      *(double *)
                       ((long)&(local_1450.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + lVar11)) * 0.5);
        local_1518 = (void *)((*(double *)
                                ((long)local_1450.
                                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8) +
                              *(double *)
                               ((long)&(local_1450.
                                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar11))
                             * 0.5);
        local_14a8 = local_1528;
        local_1528 = *(double *)
                      ((long)local_1450.
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
        local_1500 = dVar18;
        local_1418 = dVar19;
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<double,double>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &local_14a0,(double *)&local_13b8,(double *)&local_1518);
        dVar19 = local_1528;
        if (local_1528 <= local_1418) {
          dVar19 = local_1418;
        }
        dVar18 = local_1520;
        if (local_1520 <= local_1500) {
          dVar18 = local_1500;
        }
        if (local_14a8 <= local_1528) {
          local_1528 = local_14a8;
        }
        if (local_1530 <= local_1520) {
          local_1520 = local_1530;
        }
        lVar11 = lVar11 + 0x10;
        uVar16 = SUB84(local_1520,0);
        uVar17 = (undefined4)((ulong)local_1520 >> 0x20);
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    uVar9 = (uint)(uVar12 >> 4);
    if ((int)uVar9 < 1) {
      uVar16 = SUB84(dVar19,0);
      uVar17 = (undefined4)((ulong)dVar19 >> 0x20);
    }
    else {
      uVar12 = (ulong)(uVar9 & 0x7fffffff);
      lVar11 = 8;
      do {
        local_1500 = *(double *)
                      ((long)local_14a0.
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
        local_14a8 = *(double *)
                      ((long)&(local_14a0.
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + lVar11);
        local_13b8.field_0._M_file =
             (void *)((*(double *)
                        ((long)local_14a0.
                               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8) +
                      *(double *)
                       ((long)&(local_14a0.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + lVar11)) * 0.5);
        local_1518 = (void *)((*(double *)
                                ((long)local_14a0.
                                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8) +
                              *(double *)
                               ((long)&(local_14a0.
                                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar11))
                             * 0.5);
        local_1530 = dVar19;
        local_1418 = dVar18;
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<double,double>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &local_1450,(double *)&local_13b8,(double *)&local_1518);
        uVar16 = SUB84(local_1500,0);
        uVar17 = (undefined4)((ulong)local_1500 >> 0x20);
        if (local_1500 <= local_1530) {
          uVar16 = SUB84(local_1530,0);
          uVar17 = (undefined4)((ulong)local_1530 >> 0x20);
        }
        dVar18 = local_14a8;
        if (local_14a8 <= local_1418) {
          dVar18 = local_1418;
        }
        dVar19 = local_1500;
        if (local_1528 <= local_1500) {
          dVar19 = local_1528;
        }
        local_1528 = dVar19;
        dVar19 = local_14a8;
        if (local_1520 <= local_14a8) {
          dVar19 = local_1520;
        }
        local_1520 = dVar19;
        lVar11 = lVar11 + 0x10;
        dVar19 = (double)CONCAT44(uVar17,uVar16);
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    uVar12 = (long)local_14a0.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_14a0.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    local_1500 = local_1528;
    local_1528 = (double)CONCAT44(uVar17,uVar16);
    local_14a8 = local_1520;
    local_1520 = dVar18;
    std::random_device::random_device((random_device *)&local_13b8.field_0);
    uVar9 = std::random_device::_M_getval();
    local_1530 = (double)(uVar12 >> 4);
    uVar10 = uVar9 / 0x7fffffff << 0x1f | uVar9 / 0x7fffffff;
    local_13c0._M_x = (unsigned_long)(uVar10 + uVar9 + (uint)(uVar9 + uVar10 == 0));
    if (0 < (int)SUB84(local_1530,0)) {
      local_1520 = (local_1520 - local_14a8) * 0.0001;
      local_1528 = (local_1528 - local_1500) * 0.0001;
      uVar12 = (ulong)(SUB84(local_1530,0) & 0x7fffffff);
      lVar11 = 8;
      do {
        dVar19 = std::
                 generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                           (&local_13c0);
        dVar19 = dVar19 + dVar19 + -1.0;
        dVar18 = dVar19 * local_1528;
        *(double *)
         ((long)local_14a0.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8) =
             *(double *)
              ((long)local_14a0.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8) + dVar18;
        dVar19 = dVar19 * local_1520;
        *(double *)
         ((long)&(local_14a0.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first + lVar11) =
             *(double *)
              ((long)&(local_14a0.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first + lVar11) + dVar19;
        *(double *)
         ((long)local_1450.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8) =
             dVar18 + *(double *)
                       ((long)local_1450.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
        *(double *)
         ((long)&(local_1450.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first + lVar11) =
             dVar19 + *(double *)
                       ((long)&(local_1450.
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + lVar11);
        lVar11 = lVar11 + 0x10;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    this_00 = local_13f8;
    local_1518 = (void *)0x0;
    pvStack_1510 = (void *)0x0;
    iVar15 = 0;
    local_1508 = 0;
    local_1428 = 0;
    local_1438 = (void *)0x0;
    pvStack_1430 = (void *)0x0;
    if (0 < SUB84(local_1530,0)) {
      do {
        iVar13 = iVar15 + 1;
        if (iVar13 < SUB84(local_1530,0)) {
          do {
            local_1468._M_current = (int *)compute_angle(this_00,&local_14a0,iVar15,iVar13);
            local_1488._M_current = (int *)compute_angle(this_00,&local_1450,iVar15,iVar13);
            local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._0_4_ = iVar15;
            local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._4_4_ = iVar13;
            std::
            vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
            ::emplace_back<double&,std::pair<int,int>>
                      ((vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
                        *)&local_1518,(double *)&local_1468,(pair<int,_int> *)&local_14e0);
            local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._0_4_ = iVar15;
            local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._4_4_ = iVar13;
            std::
            vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
            ::emplace_back<double&,std::pair<int,int>>
                      ((vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
                        *)&local_1438,(double *)&local_1488,(pair<int,_int> *)&local_14e0);
            iVar13 = iVar13 + 1;
          } while (local_1530._0_4_ != iVar13);
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 != SUB84(local_1530,0));
    }
    pvVar6 = pvStack_1510;
    pvVar4 = local_1518;
    if (local_1518 != pvStack_1510) {
      uVar12 = (long)pvStack_1510 - (long)local_1518 >> 4;
      lVar11 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_1_>>
                (local_1518,pvStack_1510,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_1_>>
                (pvVar4,pvVar6);
    }
    pvVar6 = pvStack_1430;
    pvVar4 = local_1438;
    if (local_1438 != pvStack_1430) {
      uVar12 = (long)pvStack_1430 - (long)local_1438 >> 4;
      lVar11 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_2_>>
                (local_1438,pvStack_1430,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_2_>>
                (pvVar4,pvVar6);
    }
    local_1468._M_current = (int *)0x0;
    iStack_1460._M_current = (int *)0x0;
    local_1458 = (int *)0x0;
    local_1478 = (int *)0x0;
    local_1488._M_current = (int *)0x0;
    iStack_1480._M_current = (int *)0x0;
    local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    if (0 < local_1530._0_4_) {
      do {
        if (iStack_1460._M_current == local_1458) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_1468,iStack_1460,(int *)&local_14e0);
        }
        else {
          *iStack_1460._M_current =
               (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iStack_1460._M_current = iStack_1460._M_current + 1;
        }
        if (iStack_1480._M_current == local_1478) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_1488,iStack_1480,(int *)&local_14e0);
        }
        else {
          *iStack_1480._M_current =
               (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iStack_1480._M_current = iStack_1480._M_current + 1;
        }
        local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ =
             (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
      } while ((int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start < local_1530._0_4_);
    }
    iVar8._M_current = iStack_1460._M_current;
    _Var7._M_current = local_1468._M_current;
    if (local_1468._M_current != iStack_1460._M_current) {
      uVar12 = (long)iStack_1460._M_current - (long)local_1468._M_current >> 2;
      lVar11 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_1_>>
                (local_1468,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 iStack_1460._M_current,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_representations_include_gudhi_Sliced_Wasserstein_h:234:49)>
                  )&local_14a0);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_1_>>
                (_Var7,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       iVar8._M_current,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_representations_include_gudhi_Sliced_Wasserstein_h:234:49)>
                  )&local_14a0);
    }
    iVar8._M_current = iStack_1480._M_current;
    _Var7._M_current = local_1488._M_current;
    if (local_1488._M_current != iStack_1480._M_current) {
      uVar12 = (long)iStack_1480._M_current - (long)local_1488._M_current >> 2;
      lVar11 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_2_>>
                (local_1488,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 iStack_1480._M_current,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_representations_include_gudhi_Sliced_Wasserstein_h:240:49)>
                  )&local_1450);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_2_>>
                (_Var7,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       iVar8._M_current,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_representations_include_gudhi_Sliced_Wasserstein_h:240:49)>
                  )&local_1450);
    }
    uVar9 = SUB84(local_1530,0);
    __n = (size_type)(int)uVar9;
    std::vector<int,_std::allocator<int>_>::vector(&local_14e0,__n,(allocator_type *)&local_1410);
    std::vector<int,_std::allocator<int>_>::vector(&local_1410,__n,(allocator_type *)&local_13d8);
    if (0 < (int)uVar9) {
      uVar12 = 0;
      do {
        *(int *)(CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) +
                (long)local_1468._M_current[uVar12] * 4) = (int)uVar12;
        local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_1488._M_current[uVar12]] = (int)uVar12;
        uVar12 = uVar12 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar12);
    }
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::vector(&local_13d8,__n,(allocator_type *)&local_13f0);
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::vector(&local_13f0,__n,(allocator_type *)&local_14c8);
    uVar9 = (uint)((ulong)((long)pvStack_1510 - (long)local_1518) >> 4);
    if (0 < (int)uVar9) {
      uVar12 = (ulong)(uVar9 & 0x7fffffff);
      lVar11 = 0xc;
      do {
        local_14c8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = *(pointer *)((long)local_1518 + lVar11 + -0xc);
        iVar15 = *(int *)((long)local_1518 + lVar11 + -4);
        local_14f8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_14f8.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar15);
        local_1534 = *(int *)((long)local_1518 + lVar11);
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<int&,double&>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   (local_13d8.
                    super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   *(int *)(CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) +
                           (long)iVar15 * 4)),(int *)&local_14f8,(double *)&local_14c8);
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<int&,double&>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   (local_13d8.
                    super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   *(int *)(CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) +
                           (long)local_1534 * 4)),&local_1534,(double *)&local_14c8);
        lVar3 = CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        uVar16 = *(undefined4 *)
                  (lVar3 + (long)(int)local_14f8.
                                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start * 4);
        *(undefined4 *)
         (lVar3 + (long)(int)local_14f8.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start * 4) =
             *(undefined4 *)(lVar3 + (long)local_1534 * 4);
        *(undefined4 *)(lVar3 + (long)local_1534 * 4) = uVar16;
        lVar11 = lVar11 + 0x10;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    uVar9 = (uint)((ulong)((long)pvStack_1430 - (long)local_1438) >> 4);
    if (0 < (int)uVar9) {
      uVar12 = (ulong)(uVar9 & 0x7fffffff);
      lVar11 = 0xc;
      do {
        local_14c8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = *(pointer *)((long)local_1438 + lVar11 + -0xc);
        iVar15 = *(int *)((long)local_1438 + lVar11 + -4);
        local_14f8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_14f8.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar15);
        local_1534 = *(int *)((long)local_1438 + lVar11);
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<int&,double&>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   (local_13f0.
                    super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar15]),(int *)&local_14f8,
                   (double *)&local_14c8);
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<int&,double&>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   (local_13f0.
                    super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[local_1534]),&local_1534,(double *)&local_14c8);
        iVar15 = local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(int)local_14f8.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start];
        local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)local_14f8.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start] =
             local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[local_1534];
        local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_1534] = iVar15;
        lVar11 = lVar11 + 0x10;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    local_14f8.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_14f8.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    if (0 < local_1530._0_4_) {
      iVar15 = 0;
      do {
        local_14c8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x3ff921fb54442d18;
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<int&,double>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   (local_13d8.
                    super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   *(int *)(CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) +
                           (long)iVar15 * 4)),(int *)&local_14f8,(double *)&local_14c8);
        local_14c8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x3ff921fb54442d18;
        std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
        emplace_back<int&,double>
                  ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                   (local_13f0.
                    super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(int)local_14f8.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start]),(int *)&local_14f8,
                   (double *)&local_14c8);
        iVar15 = (int)local_14f8.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
        local_14f8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_14f8.
                               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar15);
      } while (iVar15 < local_1530._0_4_);
    }
    if ((int)SUB84(local_1530,0) < 1) {
      local_1528 = 0.0;
    }
    else {
      local_1530 = (double)(ulong)(SUB84(local_1530,0) & 0x7fffffff);
      local_1528 = 0.0;
      dVar19 = 0.0;
      do {
        local_14c8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_14c8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_14c8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_14f8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_14f8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_14f8.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1500 = dVar19;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                  (&local_14c8,
                   local_13d8.
                   super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)dVar19);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                  (&local_14f8,
                   local_13f0.
                   super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)dVar19);
        dVar19 = (local_14f8.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second;
        if ((local_14c8.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->second <=
            (local_14f8.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->second) {
          dVar19 = (local_14c8.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second;
        }
        uVar9 = 0;
        uVar16 = 0x54442d18;
        uVar17 = 0xbff921fb;
        uVar12 = 0;
        do {
          iVar15 = local_14c8.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].first;
          uVar14 = (ulong)uVar9;
          iVar13 = local_14f8.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar14].first;
          dVar18 = dVar19;
          if ((local_14a0.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar15].first !=
               local_1450.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar13].first) ||
             (NAN(local_14a0.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar15].first) ||
              NAN(local_1450.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar13].first))) {
LAB_001077f6:
            if (((double)CONCAT44(uVar17,uVar16) != dVar19) ||
               (NAN((double)CONCAT44(uVar17,uVar16)) || NAN(dVar19))) {
              local_1520 = dVar19;
              dVar19 = compute_int(local_13f8,(double)CONCAT44(uVar17,uVar16),dVar19,iVar15,iVar13,
                                   &local_14a0,&local_1450);
              local_1528 = local_1528 + dVar19;
              dVar18 = local_1520;
            }
          }
          else if ((local_14a0.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar15].second !=
                    local_1450.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar13].second) ||
                  (NAN(local_14a0.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar15].second) ||
                   NAN(local_1450.
                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar13].second)))
          goto LAB_001077f6;
          dVar5 = local_1530;
          if ((dVar18 == local_14c8.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12].second) &&
             (!NAN(dVar18) &&
              !NAN(local_14c8.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].second))) {
            uVar12 = (ulong)((int)uVar12 +
                            (uint)(uVar12 < ((long)local_14c8.
                                                                                                      
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_14c8.
                                                                                                      
                                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4) -
                                            1U));
          }
          if ((dVar18 == local_14f8.
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar14].second) &&
             (!NAN(dVar18) &&
              !NAN(local_14f8.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar14].second))) {
            uVar9 = uVar9 + (uVar14 < ((long)local_14f8.
                                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_14f8.
                                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U);
          }
          dVar19 = local_14f8.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].second;
          if (local_14c8.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar12].second <=
              local_14f8.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar9].second) {
            dVar19 = local_14c8.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12].second;
          }
          uVar16 = SUB84(dVar18,0);
          uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
        } while ((dVar18 != 1.5707963267948966) || (NAN(dVar18)));
        if (local_14f8.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_14f8.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_14f8.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_14f8.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_14c8.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_14c8.
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_14c8.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_14c8.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        dVar19 = (double)((long)local_1500 + 1);
      } while (dVar19 != dVar5);
    }
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::~vector(&local_13f0);
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::~vector(&local_13d8);
    if (local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1410.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pvVar4 = (void *)CONCAT44(local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_14e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
    }
    if (local_1488._M_current != (int *)0x0) {
      operator_delete(local_1488._M_current,(long)local_1478 - (long)local_1488._M_current);
    }
    if (local_1468._M_current != (int *)0x0) {
      operator_delete(local_1468._M_current,(long)local_1458 - (long)local_1468._M_current);
    }
    if (local_1438 != (void *)0x0) {
      operator_delete(local_1438,local_1428 - (long)local_1438);
    }
    if (local_1518 != (void *)0x0) {
      operator_delete(local_1518,local_1508 - (long)local_1518);
    }
    std::random_device::_M_fini();
  }
  else {
    local_13b8.field_0._M_file = (void *)0x0;
    local_13b8.field_0._M_func = (_func_result_type_void_ptr *)0x0;
    local_13b8._16_8_ = 0;
    local_1508 = 0;
    local_1518 = (void *)0x0;
    pvStack_1510 = (void *)0x0;
    if (this->approx < 1) {
      local_1528 = 0.0;
    }
    else {
      local_1520 = 3.141592653589793 / (double)this->approx;
      local_1528 = 0.0;
      lVar11 = 0;
      do {
        if (local_13b8.field_0._M_func != (_func_result_type_void_ptr *)local_13b8.field_0._M_file)
        {
          local_13b8.field_0._M_func = (_func_result_type_void_ptr *)local_13b8.field_0._M_file;
        }
        if (pvStack_1510 != local_1518) {
          pvStack_1510 = local_1518;
        }
        pvVar1 = (this->projections).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (second->projections_diagonal).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::
        __merge<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pvVar1[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pvVar1[lVar11].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8),
                   pvVar2[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pvVar2[lVar11].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8),&local_13b8);
        pvVar1 = (second->projections).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (this->projections_diagonal).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::
        __merge<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pvVar1[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pvVar1[lVar11].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8),
                   pvVar2[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   *(pointer *)
                    ((long)&pvVar2[lVar11].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8),&local_1518);
        uVar9 = (uint)((ulong)((long)local_13b8.field_0._M_func - local_13b8._0_8_) >> 3);
        if ((int)uVar9 < 1) {
          dVar19 = 0.0;
        }
        else {
          dVar19 = 0.0;
          uVar12 = 0;
          do {
            dVar19 = dVar19 + ABS(*(double *)((long)local_13b8.field_0._M_file + uVar12 * 8) -
                                  *(double *)((long)local_1518 + uVar12 * 8));
            uVar12 = uVar12 + 1;
          } while ((uVar9 & 0x7fffffff) != uVar12);
        }
        local_1528 = local_1528 + dVar19 * local_1520;
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->approx);
    }
    if (local_1518 != (void *)0x0) {
      operator_delete(local_1518,local_1508 - (long)local_1518);
    }
    if (local_13b8.field_0._M_file != (void *)0x0) {
      operator_delete(local_13b8.field_0._M_file,local_13b8._16_8_ - local_13b8._0_8_);
    }
  }
  if (local_1450.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1450.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1450.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1450.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_14a0.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_14a0.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_14a0.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_14a0.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_1528 / 3.141592653589793;
}

Assistant:

double compute_sliced_wasserstein_distance(const Sliced_Wasserstein& second) const {
    GUDHI_CHECK(this->approx == second.approx,
                std::invalid_argument("Error: different approx values for representations"));

    Persistence_diagram diagram1 = this->diagram;
    Persistence_diagram diagram2 = second.diagram;
    double sw = 0;

    if (this->approx == -1) {
      // Add projections onto diagonal.
      int n1, n2;
      n1 = diagram1.size();
      n2 = diagram2.size();
      double min_ordinate = std::numeric_limits<double>::max();
      double min_abscissa = std::numeric_limits<double>::max();
      double max_ordinate = std::numeric_limits<double>::lowest();
      double max_abscissa = std::numeric_limits<double>::lowest();
      for (int i = 0; i < n2; i++) {
        min_ordinate = std::min(min_ordinate, diagram2[i].second);
        min_abscissa = std::min(min_abscissa, diagram2[i].first);
        max_ordinate = std::max(max_ordinate, diagram2[i].second);
        max_abscissa = std::max(max_abscissa, diagram2[i].first);
        diagram1.emplace_back((diagram2[i].first + diagram2[i].second) / 2,
                              (diagram2[i].first + diagram2[i].second) / 2);
      }
      for (int i = 0; i < n1; i++) {
        min_ordinate = std::min(min_ordinate, diagram1[i].second);
        min_abscissa = std::min(min_abscissa, diagram1[i].first);
        max_ordinate = std::max(max_ordinate, diagram1[i].second);
        max_abscissa = std::max(max_abscissa, diagram1[i].first);
        diagram2.emplace_back((diagram1[i].first + diagram1[i].second) / 2,
                              (diagram1[i].first + diagram1[i].second) / 2);
      }
      int num_pts_dgm = diagram1.size();

      // Slightly perturb the points so that the PDs are in generic positions.
      double epsilon = 0.0001;
      double thresh_y = (max_ordinate - min_ordinate) * epsilon;
      double thresh_x = (max_abscissa - min_abscissa) * epsilon;
      std::random_device rd;
      std::default_random_engine re(rd());
      std::uniform_real_distribution<double> uni(-1, 1);
      for (int i = 0; i < num_pts_dgm; i++) {
        double u = uni(re);
        diagram1[i].first += u * thresh_x;
        diagram1[i].second += u * thresh_y;
        diagram2[i].first += u * thresh_x;
        diagram2[i].second += u * thresh_y;
      }

      // Compute all angles in both PDs.
      std::vector<std::pair<double, std::pair<int, int> > > angles1, angles2;
      for (int i = 0; i < num_pts_dgm; i++) {
        for (int j = i + 1; j < num_pts_dgm; j++) {
          double theta1 = compute_angle(diagram1, i, j);
          double theta2 = compute_angle(diagram2, i, j);
          angles1.emplace_back(theta1, std::pair<int, int>(i, j));
          angles2.emplace_back(theta2, std::pair<int, int>(i, j));
        }
      }

      // Sort angles.
      std::sort(angles1.begin(), angles1.end(),
                [](const std::pair<double, std::pair<int, int> >& p1,
                   const std::pair<double, std::pair<int, int> >& p2) { return (p1.first < p2.first); });
      std::sort(angles2.begin(), angles2.end(),
                [](const std::pair<double, std::pair<int, int> >& p1,
                   const std::pair<double, std::pair<int, int> >& p2) { return (p1.first < p2.first); });

      // Initialize orders of the points of both PDs (given by ordinates when theta = -pi/2).
      std::vector<int> orderp1, orderp2;
      for (int i = 0; i < num_pts_dgm; i++) {
        orderp1.push_back(i);
        orderp2.push_back(i);
      }
      std::sort(orderp1.begin(), orderp1.end(), [&](int i, int j) {
        if (diagram1[i].second != diagram1[j].second)
          return (diagram1[i].second < diagram1[j].second);
        else
          return (diagram1[i].first > diagram1[j].first);
      });
      std::sort(orderp2.begin(), orderp2.end(), [&](int i, int j) {
        if (diagram2[i].second != diagram2[j].second)
          return (diagram2[i].second < diagram2[j].second);
        else
          return (diagram2[i].first > diagram2[j].first);
      });

      // Find the inverses of the orders.
      std::vector<int> order1(num_pts_dgm);
      std::vector<int> order2(num_pts_dgm);
      for (int i = 0; i < num_pts_dgm; i++) {
        order1[orderp1[i]] = i;
        order2[orderp2[i]] = i;
      }

      // Record all inversions of points in the orders as theta varies along the positive half-disk.
      std::vector<std::vector<std::pair<int, double> > > anglePerm1(num_pts_dgm);
      std::vector<std::vector<std::pair<int, double> > > anglePerm2(num_pts_dgm);

      int m1 = angles1.size();
      for (int i = 0; i < m1; i++) {
        double theta = angles1[i].first;
        int p = angles1[i].second.first;
        int q = angles1[i].second.second;
        anglePerm1[order1[p]].emplace_back(p, theta);
        anglePerm1[order1[q]].emplace_back(q, theta);
        int a = order1[p];
        int b = order1[q];
        order1[p] = b;
        order1[q] = a;
      }

      int m2 = angles2.size();
      for (int i = 0; i < m2; i++) {
        double theta = angles2[i].first;
        int p = angles2[i].second.first;
        int q = angles2[i].second.second;
        anglePerm2[order2[p]].emplace_back(p, theta);
        anglePerm2[order2[q]].emplace_back(q, theta);
        int a = order2[p];
        int b = order2[q];
        order2[p] = b;
        order2[q] = a;
      }

      for (int i = 0; i < num_pts_dgm; i++) {
        anglePerm1[order1[i]].emplace_back(i, pi / 2);
        anglePerm2[order2[i]].emplace_back(i, pi / 2);
      }

      // Compute the SW distance with the list of inversions.
      for (int i = 0; i < num_pts_dgm; i++) {
        std::vector<std::pair<int, double> > u, v;
        u = anglePerm1[i];
        v = anglePerm2[i];
        double theta1, theta2;
        theta1 = -pi / 2;
        unsigned int ku, kv;
        ku = 0;
        kv = 0;
        theta2 = std::min(u[ku].second, v[kv].second);
        while (theta1 != pi / 2) {
          if (diagram1[u[ku].first].first != diagram2[v[kv].first].first ||
              diagram1[u[ku].first].second != diagram2[v[kv].first].second)
            if (theta1 != theta2) sw += compute_int(theta1, theta2, u[ku].first, v[kv].first, diagram1, diagram2);
          theta1 = theta2;
          if ((theta2 == u[ku].second) && ku < u.size() - 1) ku++;
          if ((theta2 == v[kv].second) && kv < v.size() - 1) kv++;
          theta2 = std::min(u[ku].second, v[kv].second);
        }
      }
    } else {
      double step = pi / this->approx;
      std::vector<double> v1, v2;
      for (int i = 0; i < this->approx; i++) {
        v1.clear();
        v2.clear();
        std::merge(this->projections[i].begin(), this->projections[i].end(), second.projections_diagonal[i].begin(),
                   second.projections_diagonal[i].end(), std::back_inserter(v1));
        std::merge(second.projections[i].begin(), second.projections[i].end(), this->projections_diagonal[i].begin(),
                   this->projections_diagonal[i].end(), std::back_inserter(v2));

        int n = v1.size();
        double f = 0;
        for (int j = 0; j < n; j++) f += std::abs(v1[j] - v2[j]);
        sw += f * step;
      }
    }

    return sw / pi;
  }